

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
ContainsFailure::ContainsFailure
          (ContainsFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  SimpleString *this_00;
  SimpleString *rhs;
  TestFailure *in_RCX;
  undefined8 *in_RDI;
  TestFailure *in_R8;
  SimpleString *in_R9;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  char local_60 [40];
  size_t in_stack_ffffffffffffffc8;
  
  TestFailure::TestFailure(in_RCX,(UtestShell *)in_R8,(char *)in_R9,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__ContainsFailure_001398e0;
  TestFailure::createUserText(in_R8,in_R9);
  SimpleString::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SimpleString::~SimpleString((SimpleString *)0x119b8a);
  this_00 = (SimpleString *)SimpleString::asCharString((SimpleString *)0x119b94);
  rhs = (SimpleString *)SimpleString::asCharString((SimpleString *)0x119ba5);
  StringFromFormat(local_60,"actual <%s>\n\tdid not contain  <%s>",this_00,rhs);
  SimpleString::operator+=(this_00,rhs);
  SimpleString::~SimpleString((SimpleString *)0x119be8);
  return;
}

Assistant:

ContainsFailure::ContainsFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += StringFromFormat("actual <%s>\n\tdid not contain  <%s>", actual.asCharString(), expected.asCharString());
}